

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImportedUgrid.hpp
# Opt level: O0

void __thiscall
Parfait::ImportedUgrid::ImportedUgrid
          (ImportedUgrid *this,vector<double,_std::allocator<double>_> *nodes_in,
          vector<int,_std::allocator<int>_> *triangles_in,
          vector<int,_std::allocator<int>_> *quads_in,vector<int,_std::allocator<int>_> *tets_in,
          vector<int,_std::allocator<int>_> *pyramids_in,
          vector<int,_std::allocator<int>_> *prisms_in,vector<int,_std::allocator<int>_> *hexs_in,
          vector<int,_std::allocator<int>_> *triangleTags_in,
          vector<int,_std::allocator<int>_> *quadTags_in)

{
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  int iVar4;
  int local_5c;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  int local_48 [4];
  vector<int,_std::allocator<int>_> *local_38;
  vector<int,_std::allocator<int>_> *pyramids_in_local;
  vector<int,_std::allocator<int>_> *tets_in_local;
  vector<int,_std::allocator<int>_> *quads_in_local;
  vector<int,_std::allocator<int>_> *triangles_in_local;
  vector<double,_std::allocator<double>_> *nodes_in_local;
  ImportedUgrid *this_local;
  
  local_38 = pyramids_in;
  pyramids_in_local = tets_in;
  tets_in_local = quads_in;
  quads_in_local = triangles_in;
  triangles_in_local = (vector<int,_std::allocator<int>_> *)nodes_in;
  nodes_in_local = &this->nodes;
  std::vector<double,_std::allocator<double>_>::vector(&this->nodes,nodes_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->cellMap);
  std::vector<int,_std::allocator<int>_>::vector(&this->faceMap);
  std::vector<int,_std::allocator<int>_>::vector(&this->triangles,triangles_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->quads,quads_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->tets,tets_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->pyramids,pyramids_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->prisms,prisms_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->hexs,hexs_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->triangleTags,triangleTags_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->quadTags,quadTags_in);
  std::vector<int,_std::allocator<int>_>::vector(&this->associated_component_id);
  sVar2 = std::vector<double,_std::allocator<double>_>::size(&this->nodes);
  this->nnodes = (int)sVar2 / 3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->tets);
  local_48[0] = (int)sVar2;
  if (local_48[0] < 0) {
    local_48[0] = local_48[0] + 3;
  }
  local_48[0] = local_48[0] >> 2;
  std::vector<int,_std::allocator<int>_>::push_back(&this->cellMap,local_48);
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->cellMap);
  iVar1 = *pvVar3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->pyramids);
  local_4c = iVar1 + (int)sVar2 / 5;
  std::vector<int,_std::allocator<int>_>::push_back(&this->cellMap,&local_4c);
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->cellMap);
  iVar1 = *pvVar3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->prisms);
  local_50 = iVar1 + (int)sVar2 / 6;
  std::vector<int,_std::allocator<int>_>::push_back(&this->cellMap,&local_50);
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->cellMap);
  iVar1 = *pvVar3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->hexs);
  iVar4 = (int)sVar2;
  if (iVar4 < 0) {
    iVar4 = iVar4 + 7;
  }
  local_54 = iVar1 + (iVar4 >> 3);
  std::vector<int,_std::allocator<int>_>::push_back(&this->cellMap,&local_54);
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->triangles);
  local_58 = (int)sVar2 / 3;
  std::vector<int,_std::allocator<int>_>::push_back(&this->faceMap,&local_58);
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->faceMap);
  iVar1 = *pvVar3;
  sVar2 = std::vector<int,_std::allocator<int>_>::size(&this->quads);
  iVar4 = (int)sVar2;
  if (iVar4 < 0) {
    iVar4 = iVar4 + 3;
  }
  local_5c = iVar1 + (iVar4 >> 2);
  std::vector<int,_std::allocator<int>_>::push_back(&this->faceMap,&local_5c);
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->cellMap);
  this->ncells = *pvVar3;
  pvVar3 = std::vector<int,_std::allocator<int>_>::back(&this->faceMap);
  this->nfaces = *pvVar3;
  return;
}

Assistant:

inline Parfait::ImportedUgrid::ImportedUgrid(std::vector<double> nodes_in,
																						 std::vector<int> triangles_in,
																						 std::vector<int> quads_in,
																						 std::vector<int> tets_in,
																						 std::vector<int> pyramids_in, 
																						 std::vector<int> prisms_in,
																						 std::vector<int> hexs_in, 
																						 std::vector<int> triangleTags_in, 
																						 std::vector<int> quadTags_in)
	: nodes(nodes_in),
	triangles(triangles_in),
	quads(quads_in),
	tets(tets_in),
	pyramids(pyramids_in),
	prisms(prisms_in),
	hexs(hexs_in),
    triangleTags(triangleTags_in),
    quadTags(quadTags_in)
{
	nnodes = (int)nodes.size()/3;
	cellMap.push_back((int)tets.size()/4);
	cellMap.push_back(cellMap.back() + (int)pyramids.size()/5);
	cellMap.push_back(cellMap.back() + (int)prisms.size()/6);
	cellMap.push_back(cellMap.back() + (int)hexs.size()/8);
	faceMap.push_back((int)triangles.size()/3);
	faceMap.push_back(faceMap.back() + (int)quads.size()/4);
	ncells = cellMap.back();
	nfaces = faceMap.back();
}